

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O3

void __thiscall RtMidiError::RtMidiError(RtMidiError *this,string *message,Type type)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__RtMidiError_00115640;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + message->_M_string_length);
  this->type_ = type;
  return;
}

Assistant:

RtMidiError( const std::string& message, Type type = RtMidiError::UNSPECIFIED ) throw()
    : message_(message), type_(type) {}